

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O1

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::findOrAddElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *prefixName,XMLCh *qName,uint scope,
          bool *wasAdded)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SchemaElementDecl *this_00;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_01;
  XMLSize_t XVar3;
  
  iVar2 = (*(this->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])();
  this_00 = (SchemaElementDecl *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (SchemaElementDecl *)0x0) {
    this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fMemoryManager);
    SchemaElementDecl::SchemaElementDecl
              (this_00,prefixName,baseName,uriId,Any,0xfffffffe,this->fMemoryManager);
    if (this->fElemNonDeclPool ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      this_01 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(this_01,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = this_01;
    }
    XVar3 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (this->fElemNonDeclPool,
                       ((this_00->super_XMLElementDecl).fElementName)->fLocalPart,uriId,scope,
                       this_00);
    (this_00->super_XMLElementDecl).fId = XVar3;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  *wasAdded = bVar1;
  return &this_00->super_XMLElementDecl;
}

Assistant:

XMLElementDecl* SchemaGrammar::findOrAddElemDecl (const   unsigned int    uriId
        , const XMLCh* const    baseName
        , const XMLCh* const    prefixName
        , const XMLCh* const    qName
        , unsigned int          scope
        ,       bool&           wasAdded )
{
    // See it it exists
    SchemaElementDecl* retVal = (SchemaElementDecl*) getElemDecl(uriId, baseName, qName, scope);

    // if not, then add this in
    if (!retVal)
    {
        retVal = new (fMemoryManager) SchemaElementDecl
        (
            prefixName
            , baseName
            , uriId
            , SchemaElementDecl::Any
            , Grammar::TOP_LEVEL_SCOPE
            , fMemoryManager
        );
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        const XMLSize_t elemId = fElemNonDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal);
        retVal->setId(elemId);
        wasAdded = true;
    }
     else
    {
        wasAdded = false;
    }
    return retVal;
}